

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O0

_Bool str_to_double(char *string,double *out)

{
  bool bVar1;
  int *piVar2;
  bool bVar3;
  double dVar4;
  bool local_41;
  bool local_3e;
  bool local_3d;
  _Bool result;
  _Bool valid_endptr;
  _Bool failed;
  _Bool out_of_range;
  double conv_ret_val;
  char *endptr;
  size_t sStack_20;
  _Bool terminating_f;
  size_t len;
  double *out_local;
  char *string_local;
  
  len = (size_t)out;
  out_local = (double *)string;
  sStack_20 = strlen(string);
  local_3d = false;
  if (sStack_20 != 0) {
    local_3e = true;
    if (*(char *)((long)out_local + (sStack_20 - 1)) != 'f') {
      local_3e = *(char *)((long)out_local + (sStack_20 - 1)) == 'F';
    }
    local_3d = local_3e;
  }
  endptr._7_1_ = local_3d;
  conv_ret_val = 0.0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  dVar4 = strtod((char *)out_local,(char **)&conv_ret_val);
  piVar2 = __errno_location();
  bVar3 = true;
  if (((sStack_20 != 0) && (bVar3 = true, *piVar2 != 0x22)) &&
     (bVar3 = true, (double *)conv_ret_val != out_local)) {
    bVar3 = conv_ret_val == 0.0;
  }
  local_41 = true;
  if (*(char *)conv_ret_val != '\0') {
    local_41 = (endptr._7_1_ & 1) != 0 &&
               conv_ret_val == (double)((long)out_local + (sStack_20 - 1));
  }
  bVar1 = false;
  if (!bVar3) {
    bVar1 = local_41;
  }
  if (bVar1) {
    *(double *)len = dVar4;
  }
  else {
    *(undefined8 *)len = 0x7ff8000000000000;
  }
  return bVar1;
}

Assistant:

bool str_to_double(const char *string, double *out) {
    size_t len = strlen(string);

    bool terminating_f =
        len >= 1 && (string[len - 1] == 'f' || string[len - 1] == 'F');

    char *endptr = NULL;

    errno = 0;
    double conv_ret_val = strtod(string, &endptr);

    bool out_of_range = (errno == ERANGE);
    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;

    bool valid_endptr =
        *endptr == '\0' || (terminating_f && endptr == string + len - 1);
    bool result = !failed && valid_endptr;

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = NAN;
    }

    return result;
}